

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O2

void __thiscall iffl::debug_memory_resource::decrement_busy_block_count(debug_memory_resource *this)

{
  atomic<unsigned_long> *paVar1;
  __int_type _Var2;
  
  LOCK();
  paVar1 = &this->busy_blocks_count_;
  _Var2 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if (_Var2 != 0) {
    return;
  }
  std::terminate();
}

Assistant:

void decrement_busy_block_count() noexcept {
        size_t const prev_busy_blocks_count = busy_blocks_count_.fetch_sub(1, std::memory_order_relaxed);
        FFL_CODDING_ERROR_IF_NOT(prev_busy_blocks_count > 0);
    }